

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcacheoptimizer.cpp
# Opt level: O0

void meshopt_optimizeVertexCacheFifo
               (uint *destination,uint *indices,size_t index_count,size_t vertex_count,
               uint cache_size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  size_t in_RCX;
  ulong uVar7;
  ulong in_RDX;
  meshopt_Allocator *in_RSI;
  meshopt_Allocator *in_RDI;
  uint in_R8D;
  uint *next_candidates_end;
  uint c;
  uint b;
  uint a;
  uint triangle;
  uint *it;
  uint *neighbours_end;
  uint *neighbours_begin;
  uint *next_candidates_begin;
  uint output_triangle;
  uint input_cursor;
  uint timestamp;
  uint current_vertex;
  uchar *emitted_flags;
  uint dead_end_top;
  uint *dead_end;
  uint *cache_timestamps;
  uint *live_triangles;
  TriangleAdjacency adjacency;
  size_t face_count;
  uint *indices_copy;
  meshopt_Allocator allocator;
  meshopt_Allocator *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe48;
  meshopt_Allocator *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  size_t in_stack_fffffffffffffe70;
  uint *in_stack_fffffffffffffe78;
  TriangleAdjacency *in_stack_fffffffffffffe80;
  int local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  meshopt_Allocator *local_160;
  uint local_154;
  uint *local_150;
  uint *local_148;
  uint *local_140;
  void *local_138;
  long lStack_130;
  long local_128;
  ulong local_118;
  meshopt_Allocator *local_100;
  undefined4 local_f4;
  uint local_24;
  size_t local_20;
  ulong local_18;
  meshopt_Allocator *local_10;
  meshopt_Allocator *local_8;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  meshopt_Allocator::meshopt_Allocator(in_stack_fffffffffffffe30);
  if ((local_18 == 0) || (local_20 == 0)) {
    local_f4 = 1;
  }
  else {
    if (local_8 == local_10) {
      in_stack_fffffffffffffe50 =
           (meshopt_Allocator *)
           meshopt_Allocator::allocate<unsigned_int>
                     (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_100 = in_stack_fffffffffffffe50;
      memcpy(in_stack_fffffffffffffe50,local_10,local_18 << 2);
      local_10 = local_100;
    }
    local_118 = local_18 / 3;
    local_138 = (void *)0x0;
    lStack_130 = 0;
    local_128 = 0;
    meshopt::buildTriangleAdjacency
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               (meshopt_Allocator *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    puVar5 = meshopt_Allocator::allocate<unsigned_int>
                       (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    local_140 = puVar5;
    memcpy(puVar5,local_138,local_20 << 2);
    local_148 = meshopt_Allocator::allocate<unsigned_int>(in_stack_fffffffffffffe50,(size_t)puVar5);
    memset(local_148,0,local_20 << 2);
    local_150 = meshopt_Allocator::allocate<unsigned_int>(in_stack_fffffffffffffe50,(size_t)puVar5);
    local_154 = 0;
    in_stack_fffffffffffffe30 =
         (meshopt_Allocator *)
         meshopt_Allocator::allocate<unsigned_char>(in_stack_fffffffffffffe50,(size_t)puVar5);
    local_160 = in_stack_fffffffffffffe30;
    memset(in_stack_fffffffffffffe30,0,local_118);
    local_164 = 0;
    local_168 = local_24 + 1;
    local_16c = 1;
    local_170 = 0;
    while (local_164 != 0xffffffff) {
      uVar7 = (ulong)local_154;
      puVar5 = (uint *)(local_128 + (ulong)*(uint *)(lStack_130 + (ulong)local_164 * 4) * 4);
      puVar6 = puVar5 + *(uint *)((long)local_138 + (ulong)local_164 * 4);
      for (; puVar5 != puVar6; puVar5 = puVar5 + 1) {
        uVar1 = *puVar5;
        if (*(uchar *)((long)local_160->blocks + (ulong)uVar1) == '\0') {
          uVar2 = *(uint *)((long)local_10->blocks + (ulong)(uVar1 * 3) * 4);
          uVar3 = *(uint *)((long)local_10->blocks + (ulong)(uVar1 * 3 + 1) * 4);
          uVar4 = *(uint *)((long)local_10->blocks + (ulong)(uVar1 * 3 + 2) * 4);
          *(uint *)((long)local_8->blocks + (ulong)(uint)(local_170 * 3) * 4) = uVar2;
          *(uint *)((long)local_8->blocks + (ulong)(local_170 * 3 + 1) * 4) = uVar3;
          *(uint *)((long)local_8->blocks + (ulong)(local_170 * 3 + 2) * 4) = uVar4;
          local_170 = local_170 + 1;
          local_150[local_154] = uVar2;
          local_150[local_154 + 1] = uVar3;
          local_150[local_154 + 2] = uVar4;
          local_154 = local_154 + 3;
          local_140[uVar2] = local_140[uVar2] - 1;
          local_140[uVar3] = local_140[uVar3] - 1;
          local_140[uVar4] = local_140[uVar4] - 1;
          if (local_24 < local_168 - local_148[uVar2]) {
            local_148[uVar2] = local_168;
            local_168 = local_168 + 1;
          }
          if (local_24 < local_168 - local_148[uVar3]) {
            local_148[uVar3] = local_168;
            local_168 = local_168 + 1;
          }
          if (local_24 < local_168 - local_148[uVar4]) {
            local_148[uVar4] = local_168;
            local_168 = local_168 + 1;
          }
          *(uchar *)((long)local_160->blocks + (ulong)uVar1) = '\x01';
        }
      }
      local_164 = meshopt::getNextVertexNeighbour
                            (local_150 + uVar7,local_150 + local_154,local_140,local_148,local_168,
                             local_24);
      if (local_164 == 0xffffffff) {
        local_164 = meshopt::getNextVertexDeadEnd
                              (local_150,&local_154,&local_16c,local_140,local_20);
      }
    }
    local_f4 = 0;
  }
  meshopt_Allocator::~meshopt_Allocator(in_stack_fffffffffffffe30);
  return;
}

Assistant:

void meshopt_optimizeVertexCacheFifo(unsigned int* destination, const unsigned int* indices, size_t index_count, size_t vertex_count, unsigned int cache_size)
{
	using namespace meshopt;

	assert(index_count % 3 == 0);
	assert(cache_size >= 3);

	meshopt_Allocator allocator;

	// guard for empty meshes
	if (index_count == 0 || vertex_count == 0)
		return;

	// support in-place optimization
	if (destination == indices)
	{
		unsigned int* indices_copy = allocator.allocate<unsigned int>(index_count);
		memcpy(indices_copy, indices, index_count * sizeof(unsigned int));
		indices = indices_copy;
	}

	size_t face_count = index_count / 3;

	// build adjacency information
	TriangleAdjacency adjacency = {};
	buildTriangleAdjacency(adjacency, indices, index_count, vertex_count, allocator);

	// live triangle counts
	unsigned int* live_triangles = allocator.allocate<unsigned int>(vertex_count);
	memcpy(live_triangles, adjacency.counts, vertex_count * sizeof(unsigned int));

	// cache time stamps
	unsigned int* cache_timestamps = allocator.allocate<unsigned int>(vertex_count);
	memset(cache_timestamps, 0, vertex_count * sizeof(unsigned int));

	// dead-end stack
	unsigned int* dead_end = allocator.allocate<unsigned int>(index_count);
	unsigned int dead_end_top = 0;

	// emitted flags
	unsigned char* emitted_flags = allocator.allocate<unsigned char>(face_count);
	memset(emitted_flags, 0, face_count);

	unsigned int current_vertex = 0;

	unsigned int timestamp = cache_size + 1;
	unsigned int input_cursor = 1; // vertex to restart from in case of dead-end

	unsigned int output_triangle = 0;

	while (current_vertex != ~0u)
	{
		const unsigned int* next_candidates_begin = &dead_end[0] + dead_end_top;

		// emit all vertex neighbours
		const unsigned int* neighbours_begin = &adjacency.data[0] + adjacency.offsets[current_vertex];
		const unsigned int* neighbours_end = neighbours_begin + adjacency.counts[current_vertex];

		for (const unsigned int* it = neighbours_begin; it != neighbours_end; ++it)
		{
			unsigned int triangle = *it;

			if (!emitted_flags[triangle])
			{
				unsigned int a = indices[triangle * 3 + 0], b = indices[triangle * 3 + 1], c = indices[triangle * 3 + 2];

				// output indices
				destination[output_triangle * 3 + 0] = a;
				destination[output_triangle * 3 + 1] = b;
				destination[output_triangle * 3 + 2] = c;
				output_triangle++;

				// update dead-end stack
				dead_end[dead_end_top + 0] = a;
				dead_end[dead_end_top + 1] = b;
				dead_end[dead_end_top + 2] = c;
				dead_end_top += 3;

				// update live triangle counts
				live_triangles[a]--;
				live_triangles[b]--;
				live_triangles[c]--;

				// update cache info
				// if vertex is not in cache, put it in cache
				if (timestamp - cache_timestamps[a] > cache_size)
					cache_timestamps[a] = timestamp++;

				if (timestamp - cache_timestamps[b] > cache_size)
					cache_timestamps[b] = timestamp++;

				if (timestamp - cache_timestamps[c] > cache_size)
					cache_timestamps[c] = timestamp++;

				// update emitted flags
				emitted_flags[triangle] = true;
			}
		}

		// next candidates are the ones we pushed to dead-end stack just now
		const unsigned int* next_candidates_end = &dead_end[0] + dead_end_top;

		// get next vertex
		current_vertex = getNextVertexNeighbour(next_candidates_begin, next_candidates_end, &live_triangles[0], &cache_timestamps[0], timestamp, cache_size);

		if (current_vertex == ~0u)
		{
			current_vertex = getNextVertexDeadEnd(&dead_end[0], dead_end_top, input_cursor, &live_triangles[0], vertex_count);
		}
	}

	assert(output_triangle == face_count);
}